

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O1

int Abc_NodeBalanceFindLeft(Vec_Ptr_t *vSuper)

{
  int iVar1;
  void **ppvVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar1 = vSuper->nSize;
  uVar4 = 0;
  if (2 < (long)iVar1) {
    ppvVar2 = vSuper->pArray;
    uVar5 = (ulong)(iVar1 - 3);
    do {
      if (0xfff < (*(uint *)(((ulong)ppvVar2[uVar5] & 0xfffffffffffffffe) + 0x14) ^
                  *(uint *)(((ulong)ppvVar2[(long)iVar1 + -2] & 0xfffffffffffffffe) + 0x14)))
      goto LAB_0029700e;
      bVar3 = 0 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
    uVar5 = 0xffffffff;
LAB_0029700e:
    if (((int)uVar5 < -1) || (uVar4 = (int)uVar5 + 1, iVar1 <= (int)uVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (0xfff < (*(uint *)(((ulong)ppvVar2[(long)iVar1 + -2] & 0xfffffffffffffffe) + 0x14) ^
                *(uint *)(((ulong)ppvVar2[uVar4] & 0xfffffffffffffffe) + 0x14))) {
      __assert_fail("Abc_ObjRegular(pNodeLeft)->Level == Abc_ObjRegular(pNodeRight)->Level",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0xb0,"int Abc_NodeBalanceFindLeft(Vec_Ptr_t *)");
    }
  }
  return uVar4;
}

Assistant:

int Abc_NodeBalanceFindLeft( Vec_Ptr_t * vSuper )
{
    Abc_Obj_t * pNodeRight, * pNodeLeft;
    int Current;
    // if two or less nodes, pair with the first
    if ( Vec_PtrSize(vSuper) < 3 )
        return 0;
    // set the pointer to the one before the last
    Current = Vec_PtrSize(vSuper) - 2;
    pNodeRight = (Abc_Obj_t *)Vec_PtrEntry( vSuper, Current );
    // go through the nodes to the left of this one
    for ( Current--; Current >= 0; Current-- )
    {
        // get the next node on the left
        pNodeLeft = (Abc_Obj_t *)Vec_PtrEntry( vSuper, Current );
        // if the level of this node is different, quit the loop
        if ( Abc_ObjRegular(pNodeLeft)->Level != Abc_ObjRegular(pNodeRight)->Level )
            break;
    }
    Current++;    
    // get the node, for which the equality holds
    pNodeLeft = (Abc_Obj_t *)Vec_PtrEntry( vSuper, Current );
    assert( Abc_ObjRegular(pNodeLeft)->Level == Abc_ObjRegular(pNodeRight)->Level );
    return Current;
}